

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

int mbedtls_sha256(uchar *input,size_t ilen,uchar *output,int is224)

{
  undefined1 local_9c [8];
  mbedtls_sha256_context_conflict ctx;
  int ret;
  int is224_local;
  uchar *output_local;
  size_t ilen_local;
  uchar *input_local;
  
  ctx.state[7] = 0xffffff92;
  if ((is224 == 0) || (is224 == 1)) {
    ctx.is224 = is224;
    mbedtls_sha256_init((mbedtls_sha256_context_conflict *)local_9c);
    ctx.state[7] = mbedtls_sha256_starts((mbedtls_sha256_context_conflict *)local_9c,ctx.is224);
    if ((ctx.state[7] == 0) &&
       (ctx.state[7] = mbedtls_sha256_update((mbedtls_sha256_context_conflict *)local_9c,input,ilen)
       , ctx.state[7] == 0)) {
      ctx.state[7] = mbedtls_sha256_finish((mbedtls_sha256_context_conflict *)local_9c,output);
    }
    mbedtls_sha256_free((mbedtls_sha256_context_conflict *)local_9c);
    input_local._4_4_ = ctx.state[7];
  }
  else {
    input_local._4_4_ = 0xffffff8c;
  }
  return input_local._4_4_;
}

Assistant:

int mbedtls_sha256(const unsigned char *input,
                   size_t ilen,
                   unsigned char *output,
                   int is224)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_sha256_context ctx;

#if defined(MBEDTLS_SHA224_C) && defined(MBEDTLS_SHA256_C)
    if (is224 != 0 && is224 != 1) {
        return MBEDTLS_ERR_SHA256_BAD_INPUT_DATA;
    }
#elif defined(MBEDTLS_SHA256_C)
    if (is224 != 0) {
        return MBEDTLS_ERR_SHA256_BAD_INPUT_DATA;
    }
#else /* defined MBEDTLS_SHA224_C only */
    if (is224 == 0) {
        return MBEDTLS_ERR_SHA256_BAD_INPUT_DATA;
    }
#endif

    mbedtls_sha256_init(&ctx);

    if ((ret = mbedtls_sha256_starts(&ctx, is224)) != 0) {
        goto exit;
    }

    if ((ret = mbedtls_sha256_update(&ctx, input, ilen)) != 0) {
        goto exit;
    }

    if ((ret = mbedtls_sha256_finish(&ctx, output)) != 0) {
        goto exit;
    }

exit:
    mbedtls_sha256_free(&ctx);

    return ret;
}